

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

ArrayPtr<capnp::_::RawBrandedSchema::Scope> __thiscall
kj::Arena::allocateArray<capnp::_::RawBrandedSchema::Scope>(Arena *this,size_t size)

{
  Scope *ptr;
  ArrayPtr<capnp::_::RawBrandedSchema::Scope> AVar1;
  size_t size_local;
  Arena *this_local;
  ArrayPtr<capnp::_::RawBrandedSchema::Scope> result;
  
  ptr = (Scope *)allocateBytes(this,size * 0x18,8,false);
  AVar1 = arrayPtr<capnp::_::RawBrandedSchema::Scope>(ptr,size);
  return AVar1;
}

Assistant:

ArrayPtr<T> Arena::allocateArray(size_t size) {
  if (__has_trivial_destructor(T)) {
    ArrayPtr<T> result =
        arrayPtr(reinterpret_cast<T*>(allocateBytes(
            sizeof(T) * size, alignof(T), false)), size);
    if (!__has_trivial_constructor(T)) {
      for (size_t i = 0; i < size; i++) {
        ctor(result[i]);
      }
    }
    return result;
  } else {
    // Allocate with a 64-bit prefix in which we store the array size.
    constexpr size_t prefixSize = kj::max(alignof(T), sizeof(size_t));
    void* base = allocateBytes(sizeof(T) * size + prefixSize, alignof(T), true);
    size_t& tag = *reinterpret_cast<size_t*>(base);
    ArrayPtr<T> result =
        arrayPtr(reinterpret_cast<T*>(reinterpret_cast<byte*>(base) + prefixSize), size);
    setDestructor(base, &destroyArray<T>);

    if (__has_trivial_constructor(T)) {
      tag = size;
    } else {
      // In case of constructor exceptions, we need the tag to end up storing the number of objects
      // that were successfully constructed, so that they'll be properly destroyed.
      tag = 0;
      for (size_t i = 0; i < size; i++) {
        ctor(result[i]);
        tag = i + 1;
      }
    }
    return result;
  }
}